

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::HashLen17to32(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  size_t len_local;
  char *s_local;
  
  uVar1 = len * 2 + 0x9ae16a3b2f90404f;
  uVar2 = Fetch64(s);
  uVar3 = Fetch64(s + 8);
  uVar4 = Fetch64(s + (len - 8));
  uVar4 = uVar4 * uVar1;
  uVar5 = Fetch64(s + (len - 0x10));
  uVar6 = Rotate(uVar2 * -0x4b6d499041670d8d + uVar3,0x2b);
  uVar7 = Rotate(uVar4,0x1e);
  uVar3 = Rotate(uVar3 + 0x9ae16a3b2f90404f,0x12);
  uVar1 = HashLen16(uVar6 + uVar7 + uVar5 * -0x651e95c4d06fbfb1,
                    uVar2 * -0x4b6d499041670d8d + uVar3 + uVar4,uVar1);
  return uVar1;
}

Assistant:

static uint64_t HashLen17to32(const char *s, size_t len) {
  uint64_t mul = k2 + len * 2;
  uint64_t a = Fetch64(s) * k1;
  uint64_t b = Fetch64(s + 8);
  uint64_t c = Fetch64(s + len - 8) * mul;
  uint64_t d = Fetch64(s + len - 16) * k2;
  return HashLen16(Rotate(a + b, 43) + Rotate(c, 30) + d,
                   a + Rotate(b + k2, 18) + c, mul);
}